

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O3

bool __thiscall google::protobuf::MapKey::operator==(MapKey *this,MapKey *other)

{
  size_t __n;
  CppType CVar1;
  int iVar2;
  LogMessage *pLVar3;
  bool bVar4;
  LogMessage local_60;
  LogFinisher local_21;
  
  if (this->type_ != other->type_) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/map_field.h"
               ,0xb3);
    pLVar3 = internal::LogMessage::operator<<(&local_60,"Unsupported: type mismatch");
    internal::LogFinisher::operator=(&local_21,pLVar3);
    internal::LogMessage::~LogMessage(&local_60);
  }
  CVar1 = type(this);
  switch(CVar1) {
  case CPPTYPE_INT32:
  case CPPTYPE_UINT32:
    bVar4 = (this->val_).int32_value_ == (other->val_).int32_value_;
    break;
  case CPPTYPE_INT64:
  case CPPTYPE_UINT64:
    bVar4 = (this->val_).int64_value_ == (other->val_).int64_value_;
    break;
  case CPPTYPE_DOUBLE:
  case CPPTYPE_FLOAT:
  case CPPTYPE_ENUM:
  case CPPTYPE_MESSAGE:
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/map_field.h"
               ,0xba);
    pLVar3 = internal::LogMessage::operator<<(&local_60,"Unsupported");
    internal::LogFinisher::operator=(&local_21,pLVar3);
    internal::LogMessage::~LogMessage(&local_60);
  default:
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/map_field.h"
               ,0xc9);
    pLVar3 = internal::LogMessage::operator<<(&local_60,"Can\'t get here.");
    internal::LogFinisher::operator=(&local_21,pLVar3);
    internal::LogMessage::~LogMessage(&local_60);
LAB_002de3ed:
    bVar4 = false;
    break;
  case CPPTYPE_BOOL:
    bVar4 = (this->val_).bool_value_ == (other->val_).bool_value_;
    break;
  case CPPTYPE_STRING:
    __n = *(size_t *)((long)&this->val_ + 8);
    if (__n == *(size_t *)((long)&other->val_ + 8)) {
      if (__n != 0) {
        iVar2 = bcmp((void *)(this->val_).int64_value_,(void *)(other->val_).int64_value_,__n);
        return iVar2 == 0;
      }
      return true;
    }
    goto LAB_002de3ed;
  }
  return bVar4;
}

Assistant:

bool operator==(const MapKey& other) const {
    if (type_ != other.type_) {
      // To be consistent with operator<, we don't allow this either.
      GOOGLE_LOG(FATAL) << "Unsupported: type mismatch";
    }
    switch (type()) {
      case FieldDescriptor::CPPTYPE_DOUBLE:
      case FieldDescriptor::CPPTYPE_FLOAT:
      case FieldDescriptor::CPPTYPE_ENUM:
      case FieldDescriptor::CPPTYPE_MESSAGE:
        GOOGLE_LOG(FATAL) << "Unsupported";
        break;
      case FieldDescriptor::CPPTYPE_STRING:
        return val_.string_value_.get() == other.val_.string_value_.get();
      case FieldDescriptor::CPPTYPE_INT64:
        return val_.int64_value_ == other.val_.int64_value_;
      case FieldDescriptor::CPPTYPE_INT32:
        return val_.int32_value_ == other.val_.int32_value_;
      case FieldDescriptor::CPPTYPE_UINT64:
        return val_.uint64_value_ == other.val_.uint64_value_;
      case FieldDescriptor::CPPTYPE_UINT32:
        return val_.uint32_value_ == other.val_.uint32_value_;
      case FieldDescriptor::CPPTYPE_BOOL:
        return val_.bool_value_ == other.val_.bool_value_;
    }
    GOOGLE_LOG(FATAL) << "Can't get here.";
    return false;
  }